

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int re2::StringPieceToRune(Rune *r,StringPiece *sp,RegexpStatus *status)

{
  RegexpStatus *this;
  StringPiece *rune;
  int iVar1;
  char *pcVar2;
  StringPiece local_40;
  int local_2c;
  RegexpStatus *pRStack_28;
  int n;
  RegexpStatus *status_local;
  StringPiece *sp_local;
  Rune *r_local;
  
  pRStack_28 = status;
  status_local = (RegexpStatus *)sp;
  sp_local = (StringPiece *)r;
  pcVar2 = StringPiece::data(sp);
  iVar1 = StringPiece::size((StringPiece *)status_local);
  iVar1 = fullrune(pcVar2,iVar1);
  rune = sp_local;
  if (iVar1 != 0) {
    pcVar2 = StringPiece::data((StringPiece *)status_local);
    local_2c = chartorune((Rune *)rune,pcVar2);
    if (0x10ffff < *(int *)&sp_local->ptr_) {
      local_2c = 1;
      *(undefined4 *)&sp_local->ptr_ = 0xfffd;
    }
    if ((local_2c != 1) || (*(int *)&sp_local->ptr_ != 0xfffd)) {
      StringPiece::remove_prefix((StringPiece *)status_local,local_2c);
      return local_2c;
    }
  }
  RegexpStatus::set_code(pRStack_28,kRegexpBadUTF8);
  this = pRStack_28;
  StringPiece::StringPiece(&local_40,(char *)0x0);
  RegexpStatus::set_error_arg(this,&local_40);
  return -1;
}

Assistant:

static int StringPieceToRune(Rune *r, StringPiece *sp, RegexpStatus* status) {
  int n;
  if (fullrune(sp->data(), sp->size())) {
    n = chartorune(r, sp->data());
    // Some copies of chartorune have a bug that accepts
    // encodings of values in (10FFFF, 1FFFFF] as valid.
    // Those values break the character class algorithm,
    // which assumes Runemax is the largest rune.
    if (*r > Runemax) {
      n = 1;
      *r = Runeerror;
    }
    if (!(n == 1 && *r == Runeerror)) {  // no decoding error
      sp->remove_prefix(n);
      return n;
    }
  }

  status->set_code(kRegexpBadUTF8);
  status->set_error_arg(NULL);
  return -1;
}